

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall
ColColDAGNode::getRightChildColName_abi_cxx11_(string *__return_storage_ptr__,ColColDAGNode *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->right_col_name_);
  return __return_storage_ptr__;
}

Assistant:

std::string getRightChildColName() final {
        return right_col_name_;
    }